

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O2

void __thiscall rtc::Buffer::EnsureCapacity(Buffer *this,size_t capacity)

{
  bool bVar1;
  pointer __p_00;
  ostream *poVar2;
  pointer __p;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> local_1a0;
  FatalMessage local_198;
  
  bVar1 = IsConsistent(this);
  if (!bVar1) {
    FatalMessage::FatalMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/buffer.h"
               ,0xd6);
    poVar2 = std::operator<<((ostream *)&local_198,"Check failed: IsConsistent()");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<(poVar2,"# ");
LAB_00159827:
    FatalMessage::~FatalMessage(&local_198);
  }
  if (this->capacity_ < capacity) {
    __p_00 = (pointer)operator_new__(capacity);
    memcpy(__p_00,(this->data_)._M_t.
                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,this->size_);
    local_1a0._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
         (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)0x0;
    std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
              ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)&this->data_
               ,__p_00);
    this->capacity_ = capacity;
    bVar1 = IsConsistent(this);
    if (!bVar1) {
      FatalMessage::FatalMessage
                (&local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/buffer.h"
                 ,0xdd);
      poVar2 = std::operator<<((ostream *)&local_198,"Check failed: IsConsistent()");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      std::operator<<(poVar2,"# ");
      goto LAB_00159827;
    }
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_1a0);
  }
  return;
}

Assistant:

void EnsureCapacity(size_t capacity) {
    RTC_DCHECK(IsConsistent());
    if (capacity <= capacity_)
      return;
    std::unique_ptr<uint8_t[]> new_data(new uint8_t[capacity]);
    std::memcpy(new_data.get(), data_.get(), size_);
    data_ = std::move(new_data);
    capacity_ = capacity;
    RTC_DCHECK(IsConsistent());
  }